

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O2

bool __thiscall r_exec::HLPOverlay::check_fwd_timings(HLPOverlay *this)

{
  ushort uVar1;
  ushort uVar2;
  _Object *p_Var3;
  short sVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  Atom a;
  undefined4 local_44;
  undefined4 local_3c;
  ulong local_38;
  
  p_Var3 = (this->bindings).object;
  uVar1 = *(ushort *)((long)&p_Var3[3]._vptr__Object + 2);
  uVar2 = *(ushort *)((long)&p_Var3[3]._vptr__Object + 4);
  uVar9 = r_code::Atom::asIndex();
  bVar5 = r_code::Atom::getAtomCount();
  uVar12 = 0xffff;
  uVar11 = 0;
  local_44 = 0xffff;
  local_38 = (ulong)uVar9;
  while (bVar5 != uVar11) {
    local_3c = *(undefined4 *)
                ((this->super_Overlay).code +
                (ulong)((int)uVar11 + (uVar9 + 1 & 0xffff) & 0xffff) * 4);
    cVar6 = r_code::Atom::getDescriptor();
    uVar11 = uVar11 + 1;
    if (cVar6 == -0x73) {
      bVar7 = r_code::Atom::asAssignmentIndex();
      if (uVar1 == bVar7) {
        local_44 = (undefined4)uVar11;
      }
      if (uVar2 == bVar7) {
        uVar12 = uVar11 & 0xffffffff;
      }
    }
    r_code::Atom::~Atom((Atom *)&local_3c);
  }
  sVar4 = (short)local_38;
  bVar8 = evaluate(this,(short)uVar12 + sVar4);
  if (bVar8) {
    uVar10 = BindingMap::get_fwd_before((BindingMap *)(this->bindings).object);
    uVar11 = (*Now)();
    if (uVar11 < uVar10) {
      bVar8 = evaluate(this,(short)local_44 + sVar4);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool HLPOverlay::check_fwd_timings()
{
    int16_t fwd_after_guard_index = -1;
    int16_t fwd_before_guard_index = -1;
    uint16_t bm_fwd_after_index = bindings->get_fwd_after_index();
    uint16_t bm_fwd_before_index = bindings->get_fwd_before_index();
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) { // find the relevant guards.
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        if (a.getDescriptor() == Atom::ASSIGN_PTR) {
            uint16_t _i = a.asAssignmentIndex();

            if (_i == bm_fwd_after_index) {
                fwd_after_guard_index = i;
            }

            if (_i == bm_fwd_before_index) {
                fwd_before_guard_index = i;
            }
        }
    }

    if (!evaluate(guard_set_index + fwd_before_guard_index)) {
        return false;
    }

    if (bindings->get_fwd_before() <= Now()) {
        return false;
    }

    if (!evaluate(guard_set_index + fwd_after_guard_index)) {
        return false;
    }

    return true;
}